

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
Qentem::
Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>::
operator+=(Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
           *this,LoopItem *item)

{
  LoopItem *pLVar1;
  LoopItem *pLVar2;
  char *pcVar3;
  uint uVar4;
  
  uVar4 = this->index_;
  if (uVar4 == this->capacity_) {
    resize(this,(uVar4 == 0 | uVar4) * 2);
    uVar4 = this->index_;
  }
  pcVar3 = (item->Key).storage_;
  pLVar2 = this->storage_;
  pLVar1 = pLVar2 + uVar4;
  pLVar1->Value = item->Value;
  (pLVar1->Key).storage_ = pcVar3;
  pLVar2[uVar4].Key.length_ = (item->Key).length_;
  (item->Key).storage_ = (char *)0x0;
  (item->Key).length_ = 0;
  this->index_ = uVar4 + 1;
  return;
}

Assistant:

void operator+=(Type_T &&item) {
        if (Size() == Capacity()) {
            resize((Capacity() | (Capacity() == 0)) * SizeT{2});
        }

        Memory::Initialize((Storage() + Size()), Memory::Move(item));
        ++index_;
    }